

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlsave.c
# Opt level: O0

xmlSaveCtxtPtr
xmlSaveToIO(xmlOutputWriteCallback iowrite,xmlOutputCloseCallback ioclose,void *ioctx,char *encoding
           ,int options)

{
  xmlOutputBufferPtr pxVar1;
  xmlSaveCtxtPtr ret;
  int options_local;
  char *encoding_local;
  void *ioctx_local;
  xmlOutputCloseCallback ioclose_local;
  xmlOutputWriteCallback iowrite_local;
  
  iowrite_local = (xmlOutputWriteCallback)xmlNewSaveCtxt(encoding,options);
  if ((xmlSaveCtxtPtr)iowrite_local == (xmlSaveCtxtPtr)0x0) {
    iowrite_local = (xmlOutputWriteCallback)0x0;
  }
  else {
    pxVar1 = xmlOutputBufferCreateIO(iowrite,ioclose,ioctx,((xmlSaveCtxtPtr)iowrite_local)->handler)
    ;
    ((xmlSaveCtxtPtr)iowrite_local)->buf = pxVar1;
    if (((xmlSaveCtxtPtr)iowrite_local)->buf == (xmlOutputBufferPtr)0x0) {
      xmlFreeSaveCtxt((xmlSaveCtxtPtr)iowrite_local);
      iowrite_local = (xmlOutputWriteCallback)0x0;
    }
  }
  return (xmlSaveCtxtPtr)iowrite_local;
}

Assistant:

xmlSaveCtxtPtr
xmlSaveToIO(xmlOutputWriteCallback iowrite,
            xmlOutputCloseCallback ioclose,
            void *ioctx, const char *encoding, int options)
{
    xmlSaveCtxtPtr ret;

    ret = xmlNewSaveCtxt(encoding, options);
    if (ret == NULL) return(NULL);
    ret->buf = xmlOutputBufferCreateIO(iowrite, ioclose, ioctx, ret->handler);
    if (ret->buf == NULL) {
	xmlFreeSaveCtxt(ret);
	return(NULL);
    }
    return(ret);
}